

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_sum_intra_stats(AV1_COMMON *cm,FRAME_COUNTS *counts,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,
                        MB_MODE_INFO *above_mi,MB_MODE_INFO *left_mi,int intraonly)

{
  aom_cdf_prob *paVar1;
  short *psVar2;
  BLOCK_SIZE BVar3;
  char cVar4;
  uint8_t uVar5;
  FILTER_INTRA_MODE FVar6;
  ushort uVar7;
  ushort uVar8;
  FRAME_CONTEXT *pFVar9;
  byte bVar10;
  byte bVar11;
  aom_cdf_prob (*paaVar12) [3];
  byte bVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  
  pFVar9 = xd->tile_ctx;
  bVar13 = mbmi->mode;
  BVar3 = mbmi->bsize;
  if (intraonly == 0) {
    bVar10 = ""[BVar3];
    uVar7 = pFVar9->y_mode_cdf[bVar10][0xd];
    bVar11 = (char)(uVar7 >> 4) + 5;
    lVar16 = 0;
    do {
      uVar8 = pFVar9->y_mode_cdf[bVar10][lVar16];
      if (lVar16 < (char)bVar13) {
        sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar11 & 0x1f));
      }
      else {
        sVar18 = -(uVar8 >> (bVar11 & 0x1f));
      }
      pFVar9->y_mode_cdf[bVar10][lVar16] = sVar18 + uVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0xc);
    paVar1 = pFVar9->y_mode_cdf[bVar10] + 0xd;
    *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
    bVar10 = bVar13;
  }
  else {
    bVar10 = av1_above_block_mode(above_mi);
    bVar11 = av1_left_block_mode(left_mi);
    iVar19 = intra_mode_context[bVar10];
    iVar20 = intra_mode_context[bVar11];
    uVar7 = pFVar9->kf_y_cdf[iVar19][iVar20][0xd];
    bVar10 = (char)(uVar7 >> 4) + 5;
    lVar16 = 0;
    do {
      uVar8 = pFVar9->kf_y_cdf[iVar19][iVar20][lVar16];
      if (lVar16 < (char)bVar13) {
        sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar10 & 0x1f));
      }
      else {
        sVar18 = -(uVar8 >> (bVar10 & 0x1f));
      }
      pFVar9->kf_y_cdf[iVar19][iVar20][lVar16] = sVar18 + uVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0xc);
    paVar1 = pFVar9->kf_y_cdf[iVar19][iVar20] + 0xd;
    *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
    bVar10 = mbmi->mode;
  }
  if (bVar10 == 0) {
    if (((((mbmi->palette_mode_info).palette_size[0] != '\0') ||
         (uVar21 = (ulong)mbmi->bsize, uVar21 == 0xff)) ||
        (cm->seq_params->enable_filter_intra == '\0')) ||
       (((0x1f07ffUL >> (uVar21 & 0x3f) & 1) == 0 || ((0x2f0bffUL >> (uVar21 & 0x3f) & 1) == 0))))
    goto LAB_001a0085;
    uVar5 = (mbmi->filter_intra_mode_info).use_filter_intra;
    paaVar12 = pFVar9->filter_intra_cdfs + uVar21;
    uVar7 = pFVar9->filter_intra_cdfs[uVar21][2];
    bVar11 = (char)(uVar7 >> 4) + 4;
    uVar8 = (*paaVar12)[0];
    if ((char)uVar5 < '\x01') {
      (*paaVar12)[0] = uVar8 - (uVar8 >> (bVar11 & 0x1f));
      pFVar9->filter_intra_cdfs[uVar21][2] = uVar7 + (uVar7 < 0x20);
      if (uVar5 == '\0') goto LAB_001a0085;
    }
    else {
      (*paaVar12)[0] = (short)((int)(0x8000 - (uint)uVar8) >> (bVar11 & 0x1f)) + uVar8;
      pFVar9->filter_intra_cdfs[uVar21][2] = uVar7 + (uVar7 < 0x20);
    }
    FVar6 = (mbmi->filter_intra_mode_info).filter_intra_mode;
    uVar7 = pFVar9->filter_intra_mode_cdf[5];
    bVar11 = (char)(uVar7 >> 4) + 5;
    lVar16 = 0;
    do {
      uVar8 = pFVar9->filter_intra_mode_cdf[lVar16];
      if (lVar16 < (char)FVar6) {
        sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar11 & 0x1f));
      }
      else {
        sVar18 = -(uVar8 >> (bVar11 & 0x1f));
      }
      pFVar9->filter_intra_mode_cdf[lVar16] = sVar18 + uVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    pFVar9->filter_intra_mode_cdf[5] = pFVar9->filter_intra_mode_cdf[5] + (ushort)(uVar7 < 0x20);
  }
  if (BLOCK_8X4 < BVar3 && 0xf7 < (byte)(bVar10 - 9)) {
    cVar4 = mbmi->angle_delta[0];
    uVar7 = pFVar9->angle_delta_cdf[(ulong)bVar10 - 1][7];
    bVar11 = (char)(uVar7 >> 4) + 5;
    lVar16 = 0;
    do {
      uVar8 = pFVar9->angle_delta_cdf[(ulong)bVar10 - 1][lVar16];
      if (lVar16 < (char)(cVar4 + '\x03')) {
        sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar11 & 0x1f));
      }
      else {
        sVar18 = -(uVar8 >> (bVar11 & 0x1f));
      }
      pFVar9->angle_delta_cdf[(ulong)bVar10 - 1][lVar16] = sVar18 + uVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    paVar1 = pFVar9->angle_delta_cdf[(ulong)bVar10 - 1] + 7;
    *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
  }
LAB_001a0085:
  if (xd->is_chroma_ref == true) {
    bVar11 = mbmi->uv_mode;
    uVar21 = (ulong)(*xd->mi)->bsize;
    if (xd->lossless[*(ushort *)&(*xd->mi)->field_0xa7 & 7] == 0) {
      bVar22 = (0x2f0bffUL >> (uVar21 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar21 & 0x3f) & 1) == 0) {
        bVar22 = false;
      }
    }
    else {
      bVar22 = av1_ss_size_lookup[uVar21][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y] ==
               BLOCK_4X4;
    }
    lVar15 = (ulong)bVar13 * 0x20 + (ulong)bVar13 * -2;
    lVar16 = lVar15 + (ulong)bVar22 * 0x186 + 0x3226;
    bVar17 = bVar22 + 0xd;
    uVar7 = *(ushort *)((long)pFVar9 + (ulong)bVar17 * 2 + lVar15 + (ulong)bVar22 * 0x186 + 0x3226);
    bVar13 = (char)(uVar7 >> 4) + 5;
    uVar21 = 0;
    do {
      uVar8 = *(ushort *)((long)pFVar9 + uVar21 * 2 + lVar16);
      if ((long)uVar21 < (long)(char)bVar11) {
        sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar13 & 0x1f));
      }
      else {
        sVar18 = -(uVar8 >> (bVar13 & 0x1f));
      }
      *(ushort *)((long)pFVar9 + uVar21 * 2 + lVar16) = sVar18 + uVar8;
      uVar21 = uVar21 + 1;
    } while (bVar17 - 1 != uVar21);
    psVar2 = (short *)((long)pFVar9 + (ulong)bVar17 * 2 + lVar16);
    *psVar2 = *psVar2 + (ushort)(uVar7 < 0x20);
    if (bVar11 == 0xd) {
      cVar4 = mbmi->cfl_alpha_signs;
      bVar13 = mbmi->cfl_alpha_idx;
      uVar7 = pFVar9->cfl_sign_cdf[8];
      bVar17 = (char)(uVar7 >> 4) + 5;
      lVar16 = 0;
      do {
        uVar8 = pFVar9->cfl_sign_cdf[lVar16];
        if (lVar16 < cVar4) {
          sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar17 & 0x1f));
        }
        else {
          sVar18 = -(uVar8 >> (bVar17 & 0x1f));
        }
        pFVar9->cfl_sign_cdf[lVar16] = sVar18 + uVar8;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 7);
      pFVar9->cfl_sign_cdf[8] = pFVar9->cfl_sign_cdf[8] + (ushort)(uVar7 < 0x20);
      uVar14 = (int)cVar4 + (cVar4 + 1) * 10 + 1;
      iVar19 = (int)uVar14 >> 5;
      if (0x1f < uVar14) {
        iVar20 = cVar4 + -2;
        uVar7 = pFVar9->cfl_alpha_cdf[iVar20][0x10];
        bVar17 = (char)(uVar7 >> 4) + 5;
        uVar21 = 0;
        do {
          uVar8 = pFVar9->cfl_alpha_cdf[iVar20][uVar21];
          if (uVar21 < bVar13 >> 4) {
            sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar17 & 0x1f));
          }
          else {
            sVar18 = -(uVar8 >> (bVar17 & 0x1f));
          }
          pFVar9->cfl_alpha_cdf[iVar20][uVar21] = sVar18 + uVar8;
          uVar21 = uVar21 + 1;
        } while (uVar21 != 0xf);
        paVar1 = pFVar9->cfl_alpha_cdf[iVar20] + 0x10;
        *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
      }
      iVar20 = cVar4 + 1 + iVar19 * -3;
      if (iVar20 != 0) {
        iVar19 = iVar20 * 3 + iVar19 + -3;
        uVar7 = pFVar9->cfl_alpha_cdf[iVar19][0x10];
        bVar17 = (char)(uVar7 >> 4) + 5;
        uVar21 = 0;
        do {
          uVar8 = pFVar9->cfl_alpha_cdf[iVar19][uVar21];
          if (uVar21 < (bVar13 & 0xf)) {
            sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar17 & 0x1f));
          }
          else {
            sVar18 = -(uVar8 >> (bVar17 & 0x1f));
          }
          pFVar9->cfl_alpha_cdf[iVar19][uVar21] = sVar18 + uVar8;
          uVar21 = uVar21 + 1;
        } while (uVar21 != 0xf);
        paVar1 = pFVar9->cfl_alpha_cdf[iVar19] + 0x10;
        *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
      }
    }
    bVar13 = get_uv_mode_uv2y[bVar11];
    if (BLOCK_8X4 < BVar3 && 0xf7 < (byte)(bVar13 - 9)) {
      cVar4 = mbmi->angle_delta[1];
      uVar7 = pFVar9->angle_delta_cdf[(ulong)bVar13 - 1][7];
      bVar17 = (char)(uVar7 >> 4) + 5;
      lVar16 = 0;
      do {
        uVar8 = pFVar9->angle_delta_cdf[(ulong)bVar13 - 1][lVar16];
        if (lVar16 < (char)(cVar4 + '\x03')) {
          sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar17 & 0x1f));
        }
        else {
          sVar18 = -(uVar8 >> (bVar17 & 0x1f));
        }
        pFVar9->angle_delta_cdf[(ulong)bVar13 - 1][lVar16] = sVar18 + uVar8;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      paVar1 = pFVar9->angle_delta_cdf[(ulong)bVar13 - 1] + 7;
      *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
    }
    if (((cm->features).allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < BVar3 || ((0xe007U >> (BVar3 & 0x1f) & 1) == 0)))) {
      bVar13 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[mbmi->bsize];
      iVar19 = bVar13 - 6;
      pFVar9 = xd->tile_ctx;
      if (bVar10 == 0) {
        uVar14 = 0;
        if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
          uVar14 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
        }
        uVar5 = (mbmi->palette_mode_info).palette_size[0];
        if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
          uVar14 = (uVar14 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0')
          ;
        }
        paaVar12 = pFVar9->palette_y_mode_cdf[(ulong)bVar13 - 6] + uVar14;
        uVar7 = pFVar9->palette_y_mode_cdf[(ulong)bVar13 - 6][uVar14][2];
        bVar10 = (char)(uVar7 >> 4) + 4;
        uVar8 = (*paaVar12)[0];
        if (uVar5 == '\0') {
          (*paaVar12)[0] = uVar8 - (uVar8 >> (bVar10 & 0x1f));
          pFVar9->palette_y_mode_cdf[(ulong)bVar13 - 6][uVar14][2] = uVar7 + (uVar7 < 0x20);
        }
        else {
          (*paaVar12)[0] = (short)((int)(0x8000 - (uint)uVar8) >> (bVar10 & 0x1f)) + uVar8;
          pFVar9->palette_y_mode_cdf[(ulong)bVar13 - 6][uVar14][2] = uVar7 + (uVar7 < 0x20);
          uVar7 = pFVar9->palette_y_size_cdf[(ulong)bVar13 - 6][7];
          bVar10 = (char)(uVar7 >> 4) + 5;
          lVar16 = 0;
          do {
            uVar8 = pFVar9->palette_y_size_cdf[(ulong)bVar13 - 6][lVar16];
            if (lVar16 < (char)(uVar5 + 0xfe)) {
              sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar10 & 0x1f));
            }
            else {
              sVar18 = -(uVar8 >> (bVar10 & 0x1f));
            }
            pFVar9->palette_y_size_cdf[(ulong)bVar13 - 6][lVar16] = sVar18 + uVar8;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          paVar1 = pFVar9->palette_y_size_cdf[(ulong)bVar13 - 6] + 7;
          *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
        }
      }
      if (bVar11 == 0) {
        uVar5 = (mbmi->palette_mode_info).palette_size[1];
        bVar22 = (mbmi->palette_mode_info).palette_size[0] != '\0';
        paaVar12 = pFVar9->palette_uv_mode_cdf + bVar22;
        uVar7 = pFVar9->palette_uv_mode_cdf[bVar22][2];
        bVar13 = (char)(uVar7 >> 4) + 4;
        uVar8 = (*paaVar12)[0];
        if (uVar5 == '\0') {
          (*paaVar12)[0] = uVar8 - (uVar8 >> (bVar13 & 0x1f));
          pFVar9->palette_uv_mode_cdf[bVar22][2] = uVar7 + (uVar7 < 0x20);
        }
        else {
          (*paaVar12)[0] = (short)((int)(0x8000 - (uint)uVar8) >> (bVar13 & 0x1f)) + uVar8;
          pFVar9->palette_uv_mode_cdf[bVar22][2] = uVar7 + (uVar7 < 0x20);
          uVar7 = pFVar9->palette_uv_size_cdf[iVar19][7];
          bVar13 = (char)(uVar7 >> 4) + 5;
          lVar16 = 0;
          do {
            uVar8 = pFVar9->palette_uv_size_cdf[iVar19][lVar16];
            if (lVar16 < (char)(uVar5 + 0xfe)) {
              sVar18 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar13 & 0x1f));
            }
            else {
              sVar18 = -(uVar8 >> (bVar13 & 0x1f));
            }
            pFVar9->palette_uv_size_cdf[iVar19][lVar16] = sVar18 + uVar8;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          paVar1 = pFVar9->palette_uv_size_cdf[iVar19] + 7;
          *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_sum_intra_stats(const AV1_COMMON *const cm, FRAME_COUNTS *counts,
                         MACROBLOCKD *xd, const MB_MODE_INFO *const mbmi,
                         const MB_MODE_INFO *above_mi,
                         const MB_MODE_INFO *left_mi, const int intraonly) {
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const PREDICTION_MODE y_mode = mbmi->mode;
  (void)counts;
  const BLOCK_SIZE bsize = mbmi->bsize;

  if (intraonly) {
#if CONFIG_ENTROPY_STATS
    const PREDICTION_MODE above = av1_above_block_mode(above_mi);
    const PREDICTION_MODE left = av1_left_block_mode(left_mi);
    const int above_ctx = intra_mode_context[above];
    const int left_ctx = intra_mode_context[left];
    ++counts->kf_y_mode[above_ctx][left_ctx][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(get_y_mode_cdf(fc, above_mi, left_mi), y_mode, INTRA_MODES);
  } else {
#if CONFIG_ENTROPY_STATS
    ++counts->y_mode[size_group_lookup[bsize]][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->y_mode_cdf[size_group_lookup[bsize]], y_mode, INTRA_MODES);
  }

  if (av1_filter_intra_allowed(cm, mbmi)) {
    const int use_filter_intra_mode =
        mbmi->filter_intra_mode_info.use_filter_intra;
#if CONFIG_ENTROPY_STATS
    ++counts->filter_intra[mbmi->bsize][use_filter_intra_mode];
    if (use_filter_intra_mode) {
      ++counts
            ->filter_intra_mode[mbmi->filter_intra_mode_info.filter_intra_mode];
    }
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->filter_intra_cdfs[mbmi->bsize], use_filter_intra_mode, 2);
    if (use_filter_intra_mode) {
      update_cdf(fc->filter_intra_mode_cdf,
                 mbmi->filter_intra_mode_info.filter_intra_mode,
                 FILTER_INTRA_MODES);
    }
  }
  if (av1_is_directional_mode(mbmi->mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[mbmi->mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[mbmi->mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }

  if (!xd->is_chroma_ref) return;

  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);
#if CONFIG_ENTROPY_STATS
  ++counts->uv_mode[cfl_allowed][y_mode][uv_mode];
#endif  // CONFIG_ENTROPY_STATS
  update_cdf(fc->uv_mode_cdf[cfl_allowed][y_mode], uv_mode,
             UV_INTRA_MODES - !cfl_allowed);
  if (uv_mode == UV_CFL_PRED) {
    const int8_t joint_sign = mbmi->cfl_alpha_signs;
    const uint8_t idx = mbmi->cfl_alpha_idx;

#if CONFIG_ENTROPY_STATS
    ++counts->cfl_sign[joint_sign];
#endif
    update_cdf(fc->cfl_sign_cdf, joint_sign, CFL_JOINT_SIGNS);
    if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_U(joint_sign)][CFL_IDX_U(idx)];
#endif
      update_cdf(cdf_u, CFL_IDX_U(idx), CFL_ALPHABET_SIZE);
    }
    if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_V(joint_sign)][CFL_IDX_V(idx)];
#endif
      update_cdf(cdf_v, CFL_IDX_V(idx), CFL_ALPHABET_SIZE);
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[intra_mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[intra_mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    update_palette_cdf(xd, mbmi, counts);
  }
}